

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGridSphere
          (Vec3fa *center,float radius,size_t N,Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  reference pvVar7;
  unsigned_long *puVar8;
  Vec3fa *pVVar9;
  long *in_RCX;
  ulong in_RDX;
  undefined8 *in_RSI;
  Node *in_RDI;
  uint lineStride;
  float in_XMM0_Da;
  Vec3fa p;
  size_t j;
  size_t x;
  size_t y;
  Vec3fa dy;
  Vec3fa dx;
  Vec3fa p0;
  size_t i_4;
  Ref<embree::SceneGraph::GridMeshNode> mesh;
  size_t grid_size;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  value_type *in_stack_ffffffffffffedf8;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *in_stack_ffffffffffffee00;
  size_t in_stack_ffffffffffffee08;
  float local_11b8;
  float local_11b0;
  float local_11a4;
  float local_119c;
  size_t in_stack_ffffffffffffee78;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_ffffffffffffee80;
  GridMeshNode *in_stack_ffffffffffffee88;
  BBox1f in_stack_ffffffffffffee90;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  long local_1090;
  ulong local_1088;
  ulong local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  Grid local_f1c;
  ulong local_f10;
  undefined1 local_f05;
  undefined4 local_f04;
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 uStack_ef8;
  long *local_ee8;
  _func_int **local_ee0;
  long local_ed8;
  ulong local_ec8;
  float local_ebc;
  undefined8 *local_eb8;
  long **local_ea0;
  undefined4 *local_e98;
  undefined4 *local_e90;
  undefined4 *local_e88;
  long **local_e80;
  ulong local_e70;
  reference local_e68;
  undefined8 *local_e60;
  undefined8 *local_e58;
  undefined8 *local_e50;
  undefined8 *local_e48;
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  undefined1 local_e18 [24];
  undefined8 *local_e00;
  float local_df4;
  undefined8 *local_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 *local_dd0;
  float local_dc4;
  undefined8 *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 *local_da0;
  float local_d94;
  undefined8 *local_d90;
  long local_d88;
  reference local_d80;
  _func_int **local_d78;
  _func_int ***local_d70;
  _func_int ***local_d68;
  _func_int ***local_d60;
  _func_int ***local_d58;
  _func_int ***local_d50;
  _func_int ***local_d40;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  undefined4 local_d14;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined8 *local_d08;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined8 *local_cf0;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined8 *local_cd8;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined8 *local_cc0;
  undefined4 local_cb4;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined8 *local_ca8;
  undefined4 local_c9c;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined8 *local_c90;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined8 *local_c78;
  undefined4 local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined8 *local_c60;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined4 local_c4c;
  undefined8 *local_c48;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined8 *local_c30;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined8 *local_c18;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined8 *local_c00;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined8 *local_be8;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined8 *local_bd0;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined8 *local_bb8;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined8 *local_ba0;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined8 *local_b88;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined8 *local_b70;
  undefined8 *local_b68;
  Vec3fa *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined8 *local_a40;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  undefined8 *local_9b0;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined8 *local_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  undefined8 *local_948;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined1 *local_908;
  undefined8 *local_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 *local_8e0;
  float local_8d4;
  undefined8 *local_8d0;
  float local_8c4;
  undefined8 *local_8c0;
  float local_8b4;
  undefined1 *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_594;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined8 *local_550;
  float local_544;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  ulong local_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  ulong local_4d8;
  undefined8 uStack_4d0;
  float local_4bc;
  undefined1 local_4b8 [16];
  undefined4 local_49c;
  undefined1 local_498 [16];
  undefined4 local_47c;
  undefined1 local_478 [16];
  float local_45c;
  ulong local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ulong local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  ulong local_328;
  undefined8 uStack_320;
  ulong local_318;
  undefined8 uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  reference local_90;
  Vec3fa *local_88;
  Vec3fa *local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  size_t local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_ed8 = (in_RDX + 1) * (in_RDX + 1);
  local_ec8 = in_RDX;
  local_ebc = in_XMM0_Da;
  local_eb8 = in_RSI;
  pp_Var6 = (_func_int **)::operator_new(0xa8);
  local_f05 = 1;
  local_ea0 = &local_ee8;
  local_ee8 = (long *)*in_RCX;
  if (local_ee8 != (long *)0x0) {
    (**(code **)(*local_ee8 + 0x10))();
  }
  local_f00 = 0;
  local_f04 = 0x3f800000;
  local_e88 = &local_efc;
  local_e90 = &local_f00;
  local_e98 = &local_f04;
  local_efc = 0;
  uStack_ef8 = 0x3f800000;
  GridMeshNode::GridMeshNode
            (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee90,
             in_stack_ffffffffffffee78);
  local_f05 = 0;
  local_d70 = &local_ee0;
  local_d78 = pp_Var6;
  local_ee0 = pp_Var6;
  if (pp_Var6 != (_func_int **)0x0) {
    (**(code **)(*pp_Var6 + 0x10))();
  }
  local_e80 = &local_ee8;
  if (local_ee8 != (long *)0x0) {
    (**(code **)(*local_ee8 + 0x18))();
  }
  local_d58 = &local_ee0;
  pvVar7 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_ee0 + 0xe),0);
  local_98 = local_ed8 * 6;
  local_e70 = local_98;
  local_e68 = pvVar7;
  local_28 = local_98;
  local_20 = pvVar7;
  if (pvVar7->size_alloced < local_98) {
    local_18 = local_98;
    if (pvVar7->size_alloced != 0) {
      local_30 = pvVar7->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar8 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar8;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar7->size_alloced;
  }
  local_a0 = local_18;
  uVar5 = local_98;
  if (local_98 < pvVar7->size_active) {
    while (local_a8 = uVar5, local_a8 < pvVar7->size_active) {
      uVar5 = local_a8 + 1;
    }
    pvVar7->size_active = local_98;
  }
  local_90 = pvVar7;
  if (local_18 == pvVar7->size_alloced) {
    for (local_b0 = pvVar7->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_88 = pvVar7->items + local_b0;
    }
    pvVar7->size_active = local_98;
  }
  else {
    local_b8 = pvVar7->items;
    local_50 = local_18;
    local_48 = pvVar7;
    pVVar9 = (Vec3fa *)alignedMalloc(in_stack_ffffffffffffee08,(size_t)in_stack_ffffffffffffee00);
    pvVar7->items = pVVar9;
    for (local_c0 = 0; local_c0 < pvVar7->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar7->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar7->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_80 = pvVar7->items + local_c8;
    }
    local_68 = pvVar7->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar7;
    alignedFree(in_stack_ffffffffffffedf8);
    pvVar7->size_active = local_98;
    pvVar7->size_alloced = local_a0;
  }
  for (local_f10 = 0; local_f10 < 6; local_f10 = local_f10 + 1) {
    local_d60 = &local_ee0;
    lineStride = (int)local_ec8 + 1;
    GridMeshNode::Grid::Grid
              (&local_f1c,(int)local_f10 * (int)local_ed8,lineStride,lineStride,lineStride);
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::push_back(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8);
    local_d30 = &local_f38;
    local_d28 = &local_f48;
    local_d20 = &local_f58;
    switch(local_f10) {
    case 0:
      local_d08 = &local_f68;
      local_d0c = 0xbf000000;
      local_d10 = 0xbf000000;
      local_d14 = 0xbf000000;
      local_5ac = 0;
      local_5b0 = 0xbf000000;
      local_5b4 = 0xbf000000;
      local_5b8 = 0xbf000000;
      local_5c8 = 0xbf000000bf000000;
      uStack_5c0 = 0xbf000000;
      local_f68 = 0xbf000000bf000000;
      uStack_f60 = 0xbf000000;
      local_a40 = &local_f38;
      local_a48 = &local_f68;
      local_f38 = 0xbf000000bf000000;
      uStack_f30 = 0xbf000000;
      local_cf0 = &local_f78;
      local_cf4 = 0x3f800000;
      local_cf8 = 0;
      local_cfc = 0;
      local_5cc = 0;
      local_5d0 = 0;
      local_5d4 = 0;
      local_5d8 = 0x3f800000;
      local_5e8 = 0x3f800000;
      uStack_5e0 = 0;
      local_f78 = 0x3f800000;
      uStack_f70 = 0;
      local_a50 = &local_f48;
      local_a58 = &local_f78;
      local_f48 = 0x3f800000;
      uStack_f40 = 0;
      local_cd8 = &local_f88;
      local_cdc = 0;
      local_ce0 = 0x3f800000;
      local_ce4 = 0;
      local_5ec = 0;
      local_5f0 = 0;
      local_5f4 = 0x3f800000;
      local_5f8 = 0;
      local_608 = 0x3f80000000000000;
      uStack_600 = 0;
      local_f88 = 0x3f80000000000000;
      uStack_f80 = 0;
      local_a60 = &local_f58;
      local_a68 = &local_f88;
      local_f58 = 0x3f80000000000000;
      uStack_f50 = 0;
      break;
    case 1:
      local_cc0 = &local_f98;
      local_cc4 = 0x3f000000;
      local_cc8 = 0xbf000000;
      local_ccc = 0xbf000000;
      local_60c = 0;
      local_610 = 0xbf000000;
      local_614 = 0xbf000000;
      local_618 = 0x3f000000;
      local_628 = 0xbf0000003f000000;
      uStack_620 = 0xbf000000;
      local_f98 = 0xbf0000003f000000;
      uStack_f90 = 0xbf000000;
      local_a70 = &local_f38;
      local_a78 = &local_f98;
      local_f38 = 0xbf0000003f000000;
      uStack_f30 = 0xbf000000;
      local_ca8 = &local_fa8;
      local_cac = 0;
      local_cb0 = 0;
      local_cb4 = 0x3f800000;
      local_62c = 0;
      local_630 = 0x3f800000;
      local_634 = 0;
      local_638 = 0;
      local_648 = 0;
      uStack_640 = 0x3f800000;
      local_fa8 = 0;
      uStack_fa0 = 0x3f800000;
      local_a80 = &local_f48;
      local_a88 = &local_fa8;
      local_f48 = 0;
      uStack_f40 = 0x3f800000;
      local_c90 = &local_fb8;
      local_c94 = 0;
      local_c98 = 0x3f800000;
      local_c9c = 0;
      local_64c = 0;
      local_650 = 0;
      local_654 = 0x3f800000;
      local_658 = 0;
      local_668 = 0x3f80000000000000;
      uStack_660 = 0;
      local_fb8 = 0x3f80000000000000;
      uStack_fb0 = 0;
      local_a90 = &local_f58;
      local_a98 = &local_fb8;
      local_f58 = 0x3f80000000000000;
      uStack_f50 = 0;
      break;
    case 2:
      local_c78 = &local_fc8;
      local_c7c = 0x3f000000;
      local_c80 = 0xbf000000;
      local_c84 = 0x3f000000;
      local_66c = 0;
      local_670 = 0x3f000000;
      local_674 = 0xbf000000;
      local_678 = 0x3f000000;
      local_688 = 0xbf0000003f000000;
      uStack_680 = 0x3f000000;
      local_fc8 = 0xbf0000003f000000;
      uStack_fc0 = 0x3f000000;
      local_aa0 = &local_f38;
      local_aa8 = &local_fc8;
      local_f38 = 0xbf0000003f000000;
      uStack_f30 = 0x3f000000;
      local_c60 = &local_fd8;
      local_c64 = 0xbf800000;
      local_c68 = 0;
      local_c6c = 0;
      local_68c = 0;
      local_690 = 0;
      local_694 = 0;
      local_698 = 0xbf800000;
      local_6a8 = 0xbf800000;
      uStack_6a0 = 0;
      local_fd8 = 0xbf800000;
      uStack_fd0 = 0;
      local_ab0 = &local_f48;
      local_ab8 = &local_fd8;
      local_f48 = 0xbf800000;
      uStack_f40 = 0;
      local_c48 = &local_fe8;
      local_c4c = 0;
      local_c50 = 0x3f800000;
      local_c54 = 0;
      local_6ac = 0;
      local_6b0 = 0;
      local_6b4 = 0x3f800000;
      local_6b8 = 0;
      local_6c8 = 0x3f80000000000000;
      uStack_6c0 = 0;
      local_fe8 = 0x3f80000000000000;
      uStack_fe0 = 0;
      local_ac0 = &local_f58;
      local_ac8 = &local_fe8;
      local_f58 = 0x3f80000000000000;
      uStack_f50 = 0;
      break;
    case 3:
      local_c30 = &local_ff8;
      local_c34 = 0xbf000000;
      local_c38 = 0xbf000000;
      local_c3c = 0x3f000000;
      local_6cc = 0;
      local_6d0 = 0x3f000000;
      local_6d4 = 0xbf000000;
      local_6d8 = 0xbf000000;
      local_6e8 = 0xbf000000bf000000;
      uStack_6e0 = 0x3f000000;
      local_ff8 = 0xbf000000bf000000;
      uStack_ff0 = 0x3f000000;
      local_ad0 = &local_f38;
      local_ad8 = &local_ff8;
      local_f38 = 0xbf000000bf000000;
      uStack_f30 = 0x3f000000;
      local_c18 = &local_1008;
      local_c1c = 0;
      local_c20 = 0;
      local_c24 = 0xbf800000;
      local_6ec = 0;
      local_6f0 = 0xbf800000;
      local_6f4 = 0;
      local_6f8 = 0;
      local_708 = 0;
      uStack_700 = 0xbf800000;
      local_1008 = 0;
      uStack_1000 = 0xbf800000;
      local_ae0 = &local_f48;
      local_ae8 = &local_1008;
      local_f48 = 0;
      uStack_f40 = 0xbf800000;
      local_c00 = &local_1018;
      local_c04 = 0;
      local_c08 = 0x3f800000;
      local_c0c = 0;
      local_70c = 0;
      local_710 = 0;
      local_714 = 0x3f800000;
      local_718 = 0;
      local_728 = 0x3f80000000000000;
      uStack_720 = 0;
      local_1018 = 0x3f80000000000000;
      uStack_1010 = 0;
      local_af0 = &local_f58;
      local_af8 = &local_1018;
      local_f58 = 0x3f80000000000000;
      uStack_f50 = 0;
      break;
    case 4:
      local_be8 = &local_1028;
      local_bec = 0xbf000000;
      local_bf0 = 0xbf000000;
      local_bf4 = 0xbf000000;
      local_72c = 0;
      local_730 = 0xbf000000;
      local_734 = 0xbf000000;
      local_738 = 0xbf000000;
      local_748 = 0xbf000000bf000000;
      uStack_740 = 0xbf000000;
      local_1028 = 0xbf000000bf000000;
      uStack_1020 = 0xbf000000;
      local_b00 = &local_f38;
      local_b08 = &local_1028;
      local_f38 = 0xbf000000bf000000;
      uStack_f30 = 0xbf000000;
      local_bd0 = &local_1038;
      local_bd4 = 0;
      local_bd8 = 0;
      local_bdc = 0x3f800000;
      local_74c = 0;
      local_750 = 0x3f800000;
      local_754 = 0;
      local_758 = 0;
      local_768 = 0;
      uStack_760 = 0x3f800000;
      local_1038 = 0;
      uStack_1030 = 0x3f800000;
      local_b10 = &local_f48;
      local_b18 = &local_1038;
      local_f48 = 0;
      uStack_f40 = 0x3f800000;
      local_bb8 = &local_1048;
      local_bbc = 0x3f800000;
      local_bc0 = 0;
      local_bc4 = 0;
      local_76c = 0;
      local_770 = 0;
      local_774 = 0;
      local_778 = 0x3f800000;
      local_788 = 0x3f800000;
      uStack_780 = 0;
      local_1048 = 0x3f800000;
      uStack_1040 = 0;
      local_b20 = &local_f58;
      local_b28 = &local_1048;
      local_f58 = 0x3f800000;
      uStack_f50 = 0;
      break;
    case 5:
      local_ba0 = &local_1058;
      local_ba4 = 0xbf000000;
      local_ba8 = 0x3f000000;
      local_bac = 0xbf000000;
      local_78c = 0;
      local_790 = 0xbf000000;
      local_794 = 0x3f000000;
      local_798 = 0xbf000000;
      local_7a8 = 0x3f000000bf000000;
      uStack_7a0 = 0xbf000000;
      local_1058 = 0x3f000000bf000000;
      uStack_1050 = 0xbf000000;
      local_b30 = &local_f38;
      local_b38 = &local_1058;
      local_f38 = 0x3f000000bf000000;
      uStack_f30 = 0xbf000000;
      local_b88 = &local_1068;
      local_b8c = 0x3f800000;
      local_b90 = 0;
      local_b94 = 0;
      local_7ac = 0;
      local_7b0 = 0;
      local_7b4 = 0;
      local_7b8 = 0x3f800000;
      local_7c8 = 0x3f800000;
      uStack_7c0 = 0;
      local_1068 = 0x3f800000;
      uStack_1060 = 0;
      local_b40 = &local_f48;
      local_b48 = &local_1068;
      local_f48 = 0x3f800000;
      uStack_f40 = 0;
      local_b70 = &local_1078;
      local_b74 = 0;
      local_b78 = 0;
      local_b7c = 0x3f800000;
      local_7cc = 0;
      local_7d0 = 0x3f800000;
      local_7d4 = 0;
      local_7d8 = 0;
      local_7e8 = 0;
      uStack_7e0 = 0x3f800000;
      local_1078 = 0;
      uStack_1070 = 0x3f800000;
      local_b50 = &local_f58;
      local_b58 = &local_1078;
      local_f58 = 0;
      uStack_f50 = 0x3f800000;
    }
    for (local_1080 = 0; local_1080 <= local_ec8; local_1080 = local_1080 + 1) {
      for (local_1088 = 0; local_1088 <= local_ec8; local_1088 = local_1088 + 1) {
        local_1090 = local_f10 * local_ed8 + local_1080 * (local_ec8 + 1) + local_1088;
        local_119c = (float)local_1088;
        local_11a4 = (float)local_ec8;
        local_d94 = local_119c / local_11a4;
        local_d90 = &local_10c8;
        local_da0 = &local_f48;
        local_8d0 = &local_db8;
        local_858 = CONCAT44(local_d94,local_d94);
        uStack_850 = CONCAT44(local_d94,local_d94);
        local_960 = &local_10c8;
        local_968 = &local_db8;
        local_868._0_4_ = (float)local_f48;
        local_868._4_4_ = (float)((ulong)local_f48 >> 0x20);
        uStack_860._0_4_ = (float)uStack_f40;
        uStack_860._4_4_ = (float)((ulong)uStack_f40 >> 0x20);
        local_958 = local_d94 * (float)local_868;
        fStack_954 = local_d94 * local_868._4_4_;
        fStack_950 = local_d94 * (float)uStack_860;
        fStack_94c = local_d94 * uStack_860._4_4_;
        local_948 = &local_10c8;
        local_a28 = CONCAT44(fStack_954,local_958);
        uStack_a20 = CONCAT44(fStack_94c,fStack_950);
        local_e20 = &local_10b8;
        local_e28 = &local_f38;
        local_e30 = &local_10c8;
        local_a18._0_4_ = (float)local_f38;
        local_a18._4_4_ = (float)((ulong)local_f38 >> 0x20);
        uStack_a10._0_4_ = (float)uStack_f30;
        uStack_a10._4_4_ = (float)((ulong)uStack_f30 >> 0x20);
        local_9c8 = (float)local_a18 + local_958;
        fStack_9c4 = local_a18._4_4_ + fStack_954;
        fStack_9c0 = (float)uStack_a10 + fStack_950;
        fStack_9bc = uStack_a10._4_4_ + fStack_94c;
        local_9b0 = &local_10b8;
        local_9f8 = CONCAT44(fStack_9c4,local_9c8);
        uStack_9f0 = CONCAT44(fStack_9bc,fStack_9c0);
        local_11b0 = (float)local_1080;
        local_11b8 = (float)local_ec8;
        local_dc4 = local_11b0 / local_11b8;
        local_dc0 = &local_10d8;
        local_dd0 = &local_f58;
        local_8c0 = &local_de8;
        local_878 = CONCAT44(local_dc4,local_dc4);
        uStack_870 = CONCAT44(local_dc4,local_dc4);
        local_930 = &local_10d8;
        local_938 = &local_de8;
        local_888._0_4_ = (float)local_f58;
        local_888._4_4_ = (float)((ulong)local_f58 >> 0x20);
        uStack_880._0_4_ = (float)uStack_f50;
        uStack_880._4_4_ = (float)((ulong)uStack_f50 >> 0x20);
        local_928 = local_dc4 * (float)local_888;
        fStack_924 = local_dc4 * local_888._4_4_;
        fStack_920 = local_dc4 * (float)uStack_880;
        fStack_91c = local_dc4 * uStack_880._4_4_;
        local_918 = &local_10d8;
        local_a08 = CONCAT44(fStack_924,local_928);
        uStack_a00 = CONCAT44(fStack_91c,fStack_920);
        local_e38 = &local_10a8;
        local_e40 = &local_10b8;
        local_e48 = &local_10d8;
        local_9a8 = local_9c8 + local_928;
        fStack_9a4 = fStack_9c4 + fStack_924;
        fStack_9a0 = fStack_9c0 + fStack_920;
        fStack_99c = fStack_9bc + fStack_91c;
        local_990 = &local_10a8;
        local_528 = CONCAT44(fStack_9a4,local_9a8);
        uStack_520 = CONCAT44(fStack_99c,fStack_9a0);
        local_a30 = &local_1108;
        local_a38 = &local_10a8;
        local_370 = &local_3a8;
        local_368 = local_9a8 * local_9a8;
        fStack_364 = fStack_9a4 * fStack_9a4;
        fStack_360 = fStack_9a0 * fStack_9a0;
        fStack_35c = fStack_99c * fStack_99c;
        local_288 = CONCAT44(fStack_364,local_368);
        uStack_280 = CONCAT44(fStack_35c,fStack_360);
        local_278 = &local_2b8;
        local_268 = &local_2c8;
        local_1e8 = CONCAT44(fStack_364,fStack_364);
        uStack_1e0 = CONCAT44(fStack_364,fStack_364);
        local_180 = &local_2c8;
        local_258 = &local_2d8;
        local_260 = &local_2b8;
        local_238 = CONCAT44(fStack_360,fStack_360);
        uStack_230 = CONCAT44(fStack_360,fStack_360);
        local_100 = &local_2d8;
        local_1f0 = &local_2f8;
        local_1f8 = &local_2b8;
        local_200 = &local_2c8;
        local_1c8 = local_368 + fStack_364;
        fStack_1c4 = fStack_364 + fStack_364;
        fStack_1c0 = fStack_360 + fStack_364;
        fStack_1bc = fStack_35c + fStack_364;
        local_1b8 = &local_2f8;
        local_228 = CONCAT44(fStack_1c4,local_1c8);
        uStack_220 = CONCAT44(fStack_1bc,fStack_1c0);
        local_240 = &local_2e8;
        local_248 = &local_2f8;
        local_250 = &local_2d8;
        local_4bc = local_1c8 + fStack_360;
        fStack_214 = fStack_1c4 + fStack_360;
        fStack_210 = fStack_1c0 + fStack_360;
        fStack_20c = fStack_1bc + fStack_360;
        local_208 = &local_2e8;
        local_298 = CONCAT44(fStack_214,local_4bc);
        uStack_290 = CONCAT44(fStack_20c,fStack_210);
        local_1b0 = &local_2e8;
        local_478 = ZEXT416((uint)local_4bc);
        local_4d8 = CONCAT44(0,local_4bc);
        uStack_4d0 = 0;
        uStack_320 = 0;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_4d8;
        local_4e8 = rsqrtss(auVar3,auVar3);
        local_47c = 0x3fc00000;
        local_498 = ZEXT416(0x3fc00000);
        local_3c8 = local_4e8._0_8_;
        uVar4 = local_3c8;
        uStack_3c0 = local_4e8._8_8_;
        local_3c8._0_4_ = local_4e8._0_4_;
        local_3b8 = (ulong)(uint)((float)local_3c8 * 1.5);
        uStack_3b0 = 0;
        local_49c = 0xbf000000;
        local_4b8 = ZEXT416(0xbf000000);
        local_3e8 = local_4b8._0_8_;
        uStack_3e0 = 0;
        local_3d8 = (ulong)(uint)(local_4bc * -0.5);
        uStack_3d0 = 0;
        local_408 = local_4e8._0_8_;
        uStack_400 = local_4e8._8_8_;
        local_594 = local_4bc * -0.5 * (float)local_3c8;
        local_3f8 = (ulong)(uint)local_594;
        uStack_3f0 = 0;
        local_428 = local_4e8._0_8_;
        uStack_420 = local_4e8._8_8_;
        local_418 = CONCAT44(local_4e8._4_4_,(float)local_3c8 * (float)local_3c8);
        uStack_410 = local_4e8._8_8_;
        local_448 = local_418;
        uStack_440 = local_4e8._8_8_;
        local_594 = local_594 * (float)local_3c8 * (float)local_3c8;
        local_438 = (ulong)(uint)local_594;
        uStack_430 = 0;
        local_318 = local_438;
        uStack_310 = 0;
        local_594 = (float)local_3c8 * 1.5 + local_594;
        local_308 = (ulong)(uint)local_594;
        uStack_300 = 0;
        local_4f8 = local_308;
        uStack_4f0 = 0;
        local_458 = local_308;
        uStack_450 = 0;
        local_588 = &local_1108;
        local_540 = &local_5a8;
        local_538 = CONCAT44(local_594,local_594);
        uStack_530 = CONCAT44(local_594,local_594);
        local_570 = &local_1108;
        local_580 = &local_5a8;
        local_568 = local_9a8 * local_594;
        fStack_564 = fStack_9a4 * local_594;
        fStack_560 = fStack_9a0 * local_594;
        fStack_55c = fStack_99c * local_594;
        local_550 = &local_1108;
        local_df0 = &local_10f8;
        local_df4 = local_ebc;
        local_e00 = &local_1108;
        local_8b0 = local_e18;
        local_8b4 = local_ebc;
        local_838 = local_ebc;
        local_848 = local_ebc;
        fStack_844 = local_ebc;
        fStack_840 = local_ebc;
        fStack_83c = local_ebc;
        local_900 = &local_10f8;
        local_908 = local_e18;
        local_8a8._0_4_ = (float)local_1108;
        local_8a8._4_4_ = (float)((ulong)local_1108 >> 0x20);
        uStack_8a0._0_4_ = (float)uStack_1100;
        uStack_8a0._4_4_ = (float)((ulong)uStack_1100 >> 0x20);
        local_8f8 = local_ebc * (float)local_8a8;
        fStack_8f4 = local_ebc * local_8a8._4_4_;
        fStack_8f0 = local_ebc * (float)uStack_8a0;
        fStack_8ec = local_ebc * uStack_8a0._4_4_;
        local_8e0 = &local_10f8;
        local_9e8 = CONCAT44(fStack_8f4,local_8f8);
        uStack_9e0 = CONCAT44(fStack_8ec,fStack_8f0);
        local_e50 = &local_10e8;
        local_e58 = local_eb8;
        local_e60 = &local_10f8;
        uVar1 = *local_eb8;
        uVar2 = local_eb8[1];
        local_9d8._0_4_ = (float)uVar1;
        local_9d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_9d0._0_4_ = (float)uVar2;
        uStack_9d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_988 = (float)local_9d8 + local_8f8;
        fStack_984 = local_9d8._4_4_ + fStack_8f4;
        fStack_980 = (float)uStack_9d0 + fStack_8f0;
        fStack_97c = uStack_9d0._4_4_ + fStack_8ec;
        local_978 = &local_10e8;
        local_10e8 = CONCAT44(fStack_984,local_988);
        uStack_10e0 = CONCAT44(fStack_97c,fStack_980);
        local_d68 = &local_ee0;
        local_a18 = local_f38;
        uStack_a10 = uStack_f30;
        local_9d8 = uVar1;
        uStack_9d0 = uVar2;
        local_970 = local_da0;
        local_940 = local_dd0;
        local_910 = local_e00;
        local_8d4 = local_d94;
        local_8c4 = local_dc4;
        local_8a8 = local_1108;
        uStack_8a0 = uStack_1100;
        local_888 = local_f58;
        uStack_880 = uStack_f50;
        local_868 = local_f48;
        uStack_860 = uStack_f40;
        local_828 = local_dc4;
        fStack_824 = local_dc4;
        fStack_820 = local_dc4;
        fStack_81c = local_dc4;
        local_818 = local_dc4;
        local_808 = local_d94;
        fStack_804 = local_d94;
        fStack_800 = local_d94;
        fStack_7fc = local_d94;
        local_7f8 = local_d94;
        local_590 = local_a38;
        local_578 = local_a38;
        local_544 = local_594;
        local_518 = local_594;
        fStack_514 = local_594;
        fStack_510 = local_594;
        fStack_50c = local_594;
        local_508 = local_594;
        local_45c = local_4bc;
        local_3c8 = uVar4;
        local_390 = local_a38;
        local_388 = local_a38;
        local_380 = local_a38;
        local_378 = local_a38;
        local_350 = local_370;
        local_348 = local_528;
        uStack_340 = uStack_520;
        local_338 = local_528;
        uStack_330 = uStack_520;
        local_328 = local_4d8;
        local_2a0 = local_370;
        local_270 = local_278;
        local_218 = local_4bc;
        local_1d8 = local_288;
        uStack_1d0 = uStack_280;
        local_1a8 = local_278;
        local_1a0 = local_268;
        local_198 = local_1e8;
        uStack_190 = uStack_1e0;
        local_178 = fStack_364;
        fStack_174 = fStack_364;
        fStack_170 = fStack_364;
        fStack_16c = fStack_364;
        local_168 = local_288;
        uStack_160 = uStack_280;
        local_150 = local_278;
        local_148 = local_200;
        local_140 = local_1f8;
        local_138 = local_250;
        local_130 = local_248;
        local_128 = local_260;
        local_120 = local_258;
        local_118 = local_238;
        uStack_110 = uStack_230;
        local_f8 = fStack_360;
        fStack_f4 = fStack_360;
        fStack_f0 = fStack_360;
        fStack_ec = fStack_360;
        local_e8 = local_288;
        uStack_e0 = uStack_280;
        local_d0 = local_260;
        local_1108 = CONCAT44(fStack_564,local_568);
        uStack_1100 = CONCAT44(fStack_55c,fStack_560);
        local_10f8 = local_9e8;
        uStack_10f0 = uStack_9e0;
        local_10d8 = local_a08;
        uStack_10d0 = uStack_a00;
        local_10c8 = local_a28;
        uStack_10c0 = uStack_a20;
        local_10b8 = local_9f8;
        uStack_10b0 = uStack_9f0;
        local_10a8 = local_528;
        uStack_10a0 = uStack_520;
        local_de8 = local_878;
        uStack_de0 = uStack_870;
        local_db8 = local_858;
        uStack_db0 = uStack_850;
        local_5a8 = local_538;
        uStack_5a0 = uStack_530;
        local_3a8 = local_288;
        uStack_3a0 = uStack_280;
        local_2f8 = local_228;
        uStack_2f0 = uStack_220;
        local_2e8 = local_298;
        uStack_2e0 = uStack_290;
        local_2d8 = local_238;
        uStack_2d0 = uStack_230;
        local_2c8 = local_1e8;
        uStack_2c0 = uStack_1e0;
        local_2b8 = local_288;
        uStack_2b0 = uStack_280;
        local_d80 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(local_ee0 + 0xe),0);
        local_d88 = local_1090;
        local_b60 = local_d80->items + local_1090;
        local_b68 = &local_10e8;
        *(undefined8 *)&local_b60->field_0 = local_10e8;
        *(undefined8 *)((long)&local_b60->field_0 + 8) = uStack_10e0;
      }
    }
  }
  local_d50 = &local_ee0;
  local_10 = local_ee0;
  (in_RDI->super_RefCount)._vptr_RefCount = local_ee0;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_d40 = &local_ee0;
  if (local_ee0 != (_func_int **)0x0) {
    (**(code **)(*local_ee0 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGridSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    size_t grid_size = (N+1)*(N+1);
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(grid_size*6);

    for (size_t i=0; i<6; i++)
    {
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(unsigned(i*grid_size),unsigned(N+1),unsigned(N+1),unsigned(N+1)));
      Vec3fa p0, dx, dy;
      switch (i) {
      case 0: p0 = Vec3fa(-0.5f,-0.5f,-0.5f); dx = Vec3fa(+1,0, 0); dy = Vec3fa(0,1,0); break;
      case 1: p0 = Vec3fa(+0.5f,-0.5f,-0.5f); dx = Vec3fa( 0,0,+1); dy = Vec3fa(0,1,0); break;
      case 2: p0 = Vec3fa(+0.5f,-0.5f,+0.5f); dx = Vec3fa(-1,0, 0); dy = Vec3fa(0,1,0); break;
      case 3: p0 = Vec3fa(-0.5f,-0.5f,+0.5f); dx = Vec3fa( 0,0,-1); dy = Vec3fa(0,1,0); break;
      case 4: p0 = Vec3fa(-0.5f,-0.5f,-0.5f); dx = Vec3fa( 0,0,+1); dy = Vec3fa(1,0,0); break;
      case 5: p0 = Vec3fa(-0.5f,+0.5f,-0.5f); dx = Vec3fa( 1,0, 0); dy = Vec3fa(0,0,1); break;
      default: assert(false);
      }
      
      for (size_t y=0; y<=N; y++) {
        for (size_t x=0; x<=N; x++) {
          size_t j = i*grid_size + y*(N+1) + x;
          Vec3fa p = p0+float(x)/float(N)*dx+float(y)/float(N)*dy;
          mesh->positions[0][j] = center + radius*normalize(p);
        }
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }